

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Body.h
# Opt level: O0

void __thiscall
RigidBodyDynamics::Body::Separate(Body *this,SpatialTransform *transform,Body *other_body)

{
  undefined8 uVar1;
  double *in_RDX;
  double *in_RDI;
  Matrix3d new_inertia;
  Matrix3d inertia_substracted;
  Matrix3d inertia_other_com_rotated_this_origin;
  SpatialRigidBodyInertia this_rbi;
  Vector3d new_com;
  Vector3d other_com;
  Scalar new_mass;
  Scalar other_mass;
  Body *in_stack_fffffffffffff888;
  MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_fffffffffffff890;
  Body *this_00;
  Matrix3d *mass;
  Body *this_01;
  string *in_stack_fffffffffffff8a8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *this_02;
  RBDLError *in_stack_fffffffffffff8b0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *other;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffff8b8;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_03;
  allocator<char> *in_stack_fffffffffffff8c0;
  char *in_stack_fffffffffffff8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8d0;
  StorageBaseType *matrix;
  double *in_stack_fffffffffffff8d8;
  double *scalar;
  Vector3d *vector;
  bool local_691;
  Body local_690;
  Matrix3d *in_stack_fffffffffffffa08;
  Vector3d *in_stack_fffffffffffffa10;
  Scalar in_stack_fffffffffffffa18;
  SpatialRigidBodyInertia *in_stack_fffffffffffffa38;
  StorageBaseType local_4a8 [296];
  Body *in_stack_fffffffffffffc80;
  SpatialTransform *in_stack_fffffffffffffc88;
  Vector3d local_308 [10];
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_210 [40];
  undefined1 local_1e8 [136];
  double local_160;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_158 [152];
  non_const_type local_c0;
  Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_b8;
  Body local_a8;
  double local_38;
  double local_30;
  double *local_18;
  
  local_691 = false;
  local_18 = in_RDX;
  if ((*in_RDX == 0.0) && (!NAN(*in_RDX))) {
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
    local_691 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator==
                          ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           in_stack_fffffffffffff8b0,
                           (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                            *)in_stack_fffffffffffff8a8);
  }
  if (local_691 == false) {
    local_30 = *local_18;
    local_38 = *in_RDI - local_30;
    if ((local_38 == 0.0) && (!NAN(local_38))) {
      local_a8.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[3]._3_1_ = 1;
      uVar1 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
      Errors::RBDLError::RBDLError(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
      local_a8.mInertia.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[3]._3_1_ = 0;
      __cxa_throw(uVar1,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
    local_c0 = (non_const_type)
               Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                          in_stack_fffffffffffff888);
    local_b8 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>>::operator*
                         (in_stack_fffffffffffff890,
                          (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                          in_stack_fffffffffffff888);
    this_00 = &local_a8;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>>
    ::operator+((MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                 *)in_stack_fffffffffffff8b8,
                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff8b0);
    mass = &local_a8.mInertia;
    Vector3_t::
    Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Vector3_t *)this_00,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffff888);
    local_160 = 1.0 / local_38;
    this_01 = (Body *)local_1e8;
    Eigen::operator*(in_stack_fffffffffffff8d8,(StorageBaseType *)in_stack_fffffffffffff8d0);
    this_02 = local_210;
    Eigen::operator*(in_stack_fffffffffffff8d8,(StorageBaseType *)in_stack_fffffffffffff8d0);
    other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)(local_1e8 + 0x28);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
    ::operator-(in_stack_fffffffffffff8b8,other);
    this_03 = local_158;
    Eigen::operator*(in_stack_fffffffffffff8d8,(StorageBaseType *)in_stack_fffffffffffff8d0);
    Vector3_t::
    Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
              ((Vector3_t *)this_00,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                *)in_stack_fffffffffffff888);
    Math::SpatialRigidBodyInertia::createFromMassComInertiaC
              (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
    TransformInertiaToBodyFrame(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    matrix = local_4a8;
    Math::SpatialRigidBodyInertia::toMatrix(in_stack_fffffffffffffa38);
    scalar = (double *)&stack0xfffffffffffffc80;
    Eigen::DenseBase<Eigen::Matrix<double,6,6,0,6,6>>::block<3,3>
              ((DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)this_01,(Index)mass,
               (Index)this_00);
    Matrix3_t::Matrix3_t<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,3,3,false>>
              ((Matrix3_t *)this_00,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_3,_3,_false>_> *)
               in_stack_fffffffffffff888);
    vector = local_308;
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-
              (this_03,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other);
    Matrix3_t::
    Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>>
              ((Matrix3_t *)this_00,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)in_stack_fffffffffffff888);
    Math::VectorCrossMatrix(vector);
    Eigen::operator*(scalar,matrix);
    Math::VectorCrossMatrix(vector);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff888);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
    ::operator*(this_02,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                        this_01);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-
              (this_03,(MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
                        *)other);
    Matrix3_t::
    Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const>>
              ((Matrix3_t *)this_00,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>_>
                *)in_stack_fffffffffffff888);
    Body(this_01,(Scalar *)mass,(Vector3d *)this_00,(Matrix3d *)in_stack_fffffffffffff888);
    operator=(this_00,in_stack_fffffffffffff888);
    ~Body(&local_690);
  }
  return;
}

Assistant:

void Separate(const Math::SpatialTransform &transform, const Body &other_body)
  {
#ifndef RBDL_USE_CASADI_MATH
    // nothing to do if we join a massles body to the current.
    if (other_body.mMass == 0. && other_body.mInertia == Math::Matrix3d::Zero())
    {
      return;
    }
#endif

    Math::Scalar other_mass = other_body.mMass;
    Math::Scalar new_mass = mMass - other_mass;

#ifndef RBDL_USE_CASADI_MATH
    if (new_mass == 0.)
    {
      throw Errors::RBDLError("Error: cannot separate bodies as both have zero mass!\n");
    }
#endif

    Math::Vector3d other_com =
        transform.E.transpose() * other_body.mCenterOfMass + transform.r;
    Math::Vector3d new_com = (1 / new_mass) * (mMass * mCenterOfMass - other_mass * other_com);

    LOG << "other_com = " << std::endl << other_com.transpose() << std::endl;
    LOG << "rotation = " << std::endl << transform.E << std::endl;

    // We have to transform the inertia of other_body to current COM (before separation).
    // This is done in 4 steps:
    // 1. Transform the inertia from other origin to other COM
    // 2. Rotate the inertia that it is aligned to the frame of this body
    // 3. Transform inertia of other_body to the origin of the frame of
    // this body
    // 4. Substract the two inertias
    // 5. Transform the new inertia to the new COM

    Math::SpatialRigidBodyInertia this_rbi =
        Math::SpatialRigidBodyInertia::createFromMassComInertiaC(mMass, mCenterOfMass, mInertia);

    Math::Matrix3d inertia_other_com_rotated_this_origin =
        TransformInertiaToBodyFrame(transform, other_body);

    // 4. Substract the two inertias
    Math::Matrix3d inertia_substracted = Math::Matrix3d(this_rbi.toMatrix().block<3, 3>(0, 0)) -
                                         inertia_other_com_rotated_this_origin;
    LOG << "inertia_substracted  = " << std::endl << inertia_substracted << std::endl;

    // 5. Transform the summed inertia to the new COM
    Math::Matrix3d new_inertia =
        inertia_substracted - new_mass * Math::VectorCrossMatrix(new_com) *
                                  Math::VectorCrossMatrix(new_com).transpose();

    *this = Body (new_mass, new_com, new_inertia);
  }